

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EmptyMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyMemberSyntax,slang::syntax::EmptyMemberSyntax_const&>
          (BumpAllocator *this,EmptyMemberSyntax *args)

{
  EmptyMemberSyntax *this_00;
  
  this_00 = (EmptyMemberSyntax *)allocate(this,0x98,8);
  syntax::EmptyMemberSyntax::EmptyMemberSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }